

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNFill.cpp
# Opt level: O2

void __thiscall NaPNFill::post_action(NaPNFill *this)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  NaVector *pNVar4;
  undefined4 extraout_var;
  
  uVar1 = NaPetriNode::activations(&this->super_NaPetriNode);
  if (this->nFill < uVar1) {
    NaPetriCnInput::commit_data(&this->in);
  }
  NaPetriCnOutput::commit_data(&this->out);
  uVar2 = NaPetriNode::activations(&this->super_NaPetriNode);
  uVar1 = this->nFill;
  pNVar4 = NaPetriCnOutput::data(&this->sync);
  iVar3 = (*pNVar4->_vptr_NaVector[8])(pNVar4,0);
  *(undefined8 *)CONCAT44(extraout_var,iVar3) =
       *(undefined8 *)(&DAT_0015ec38 + (ulong)(uVar1 < uVar2) * 8);
  NaPetriCnOutput::commit_data(&this->sync);
  return;
}

Assistant:

void
NaPNFill::post_action ()
{
  // <= due to activations() already ++
  if(activations() > nFill){
    // Case of simple transfer
    
    // Commit input to get next data portion
    in.commit_data();
  }

  // Case of filling and simple transfer
  out.commit_data();

  if(activations() > nFill)
    sync.data()[0] = 1;
  else
    sync.data()[0] = -1;

  // Commit synchronization
  sync.commit_data();
}